

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DirectMSFStream.cpp
# Opt level: O1

void __thiscall
PDB::DirectMSFStream::ReadAtOffset
          (DirectMSFStream *this,void *destination,size_t size,size_t offset)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  void *__dest;
  size_t __n;
  ulong __n_00;
  long lVar5;
  
  bVar1 = (byte)this->m_blockSizeLog2;
  uVar3 = offset >> (bVar1 & 0x3f);
  uVar2 = (ulong)((uint)offset & this->m_blockSize - 1);
  __n_00 = this->m_blockSize - uVar2;
  pvVar4 = (void *)((long)this->m_data +
                   uVar2 + ((ulong)this->m_blockIndices[uVar3] << (bVar1 & 0x3f)));
  if (__n_00 < size) {
    memcpy(destination,pvVar4,__n_00);
    __n = size - __n_00;
    if (__n != 0) {
      lVar5 = uVar3 * 4;
      do {
        lVar5 = lVar5 + 4;
        __dest = (void *)((size - __n) + (long)destination);
        pvVar4 = (void *)(((ulong)*(uint *)((long)this->m_blockIndices + lVar5) <<
                          ((byte)this->m_blockSizeLog2 & 0x3f)) + (long)this->m_data);
        if (this->m_blockSize < __n) {
          memcpy(__dest,pvVar4,(ulong)this->m_blockSize);
          __n = __n - this->m_blockSize;
        }
        else {
          memcpy(__dest,pvVar4,__n);
          __n = 0;
        }
      } while (__n != 0);
    }
    return;
  }
  memcpy(destination,pvVar4,size);
  return;
}

Assistant:

void PDB::DirectMSFStream::ReadAtOffset(void* destination, size_t size, size_t offset) const PDB_NO_EXCEPT
{
	PDB_ASSERT(destination != nullptr, "Destination buffer not set");
	PDB_ASSERT(offset + size <= m_size, "Not enough data left to read.");

	// work out which block and offset within the block the read offset corresponds to
	size_t blockIndex = offset >> m_blockSizeLog2;
	const size_t offsetWithinBlock = offset & (m_blockSize - 1u);

	// work out the offset within the data based on the block indices
	size_t offsetWithinData = (static_cast<size_t>(m_blockIndices[blockIndex]) << m_blockSizeLog2) + offsetWithinBlock;
	const size_t bytesLeftInBlock = m_blockSize - offsetWithinBlock;

	if (bytesLeftInBlock >= size)
	{
		// fast path, all the data can be read in one go
		const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);
		std::memcpy(destination, sourceData, size);
	}
	else
	{
		// slower path, data is scattered across several blocks.
		// read remaining bytes in current block first.
		{
			const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);
			std::memcpy(destination, sourceData, bytesLeftInBlock);
		}

		// read remaining bytes from blocks
		size_t bytesLeftToRead = size - bytesLeftInBlock;
		while (bytesLeftToRead != 0u)
		{
			// advance to the next block
			++blockIndex;
			offsetWithinData = static_cast<size_t>(m_blockIndices[blockIndex]) << m_blockSizeLog2;

			void* const destinationData = Pointer::Offset<void*>(destination, size - bytesLeftToRead);
			const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);

			if (bytesLeftToRead > m_blockSize)
			{
				// copy a whole block at once
				std::memcpy(destinationData, sourceData, m_blockSize);
				bytesLeftToRead -= m_blockSize;
			}
			else
			{
				// copy remaining bytes
				std::memcpy(destinationData, sourceData, bytesLeftToRead);
				bytesLeftToRead -= bytesLeftToRead;
			}
		}
	}
}